

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondTypeParser.cpp
# Opt level: O2

void __thiscall OpenMD::BondTypeParser::BondTypeParser(BondTypeParser *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  allocator<char> local_31;
  key_type local_30;
  
  p_Var1 = &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Fixed",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = btFixed;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Harmonic",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = btHarmonic;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Cubic",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = btCubic;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Quartic",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = btQuartic;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Polynomial",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = btPolynomial;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Morse",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = btMorse;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ShiftedMie",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = btShiftedMie;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

BondTypeParser::BondTypeParser() {
    stringToEnumMap_["Fixed"]      = btFixed;
    stringToEnumMap_["Harmonic"]   = btHarmonic;
    stringToEnumMap_["Cubic"]      = btCubic;
    stringToEnumMap_["Quartic"]    = btQuartic;
    stringToEnumMap_["Polynomial"] = btPolynomial;
    stringToEnumMap_["Morse"]      = btMorse;
    stringToEnumMap_["ShiftedMie"] = btShiftedMie;
  }